

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O3

spv_result_t spvtools::val::MaximalReconvergenceChecks(ValidationState_t *_)

{
  _Rb_tree_color _Var1;
  pointer puVar2;
  pointer pFVar3;
  _Hash_node_base *p_Var4;
  Instruction *pIVar5;
  pointer ppBVar6;
  pointer ppVar7;
  ValidationState_t *this;
  __buckets_ptr pp_Var8;
  size_type sVar9;
  uint uVar10;
  uint uVar11;
  const_iterator cVar12;
  vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_> *pvVar13;
  _Rb_tree_node_base *p_Var14;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *pvVar15;
  Instruction *pIVar16;
  __hash_code __code;
  long lVar17;
  pointer pFVar18;
  pointer ppVar19;
  long lVar20;
  ulong uVar21;
  Function *func;
  pointer puVar22;
  pointer ppBVar23;
  spv_result_t sVar24;
  pointer ppBVar25;
  bool bVar26;
  uint entry_point;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  maximal_funcs;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  maximal_entry_points;
  uint32_t local_2dc;
  ValidationState_t *local_2d8;
  Function *local_2d0;
  BasicBlock *local_2c8;
  pointer local_2c0;
  pointer local_2b8;
  undefined1 local_2b0 [56];
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_278;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_240;
  undefined1 local_208 [16];
  _Link_type local_1f8;
  _Rb_tree_node_base *local_1f0;
  spv_result_t local_38;
  
  local_278._M_buckets = &local_278._M_single_bucket;
  local_278._M_bucket_count = 1;
  local_278._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_278._M_element_count = 0;
  local_278._M_rehash_policy._M_max_load_factor = 1.0;
  local_278._M_rehash_policy._M_next_resize = 0;
  local_278._M_single_bucket = (__node_base_ptr)0x0;
  local_240._M_buckets = &local_240._M_single_bucket;
  local_240._M_bucket_count = 1;
  local_240._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_240._M_element_count = 0;
  local_240._M_rehash_policy._M_max_load_factor = 1.0;
  local_240._M_rehash_policy._M_next_resize = 0;
  local_240._M_single_bucket = (__node_base_ptr)0x0;
  puVar22 = (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  sVar24 = SPV_SUCCESS;
  if (puVar22 != puVar2) {
    do {
      local_2b0._0_4_ = *puVar22;
      local_208._0_4_ = *puVar22;
      cVar12 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(_->entry_point_to_execution_modes_)._M_h,(key_type_conflict *)local_208);
      if ((cVar12.
           super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
           ._M_cur != (__node_type *)0x0) &&
         (lVar17 = *(long *)((long)cVar12.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                                   ._M_cur + 0x20), lVar17 != 0)) {
        lVar20 = (long)cVar12.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                       ._M_cur + 0x18;
        do {
          bVar26 = *(uint *)(lVar17 + 0x20) < 0x1787;
          if (!bVar26) {
            lVar20 = lVar17;
          }
          lVar17 = *(long *)(lVar17 + 0x10 + (ulong)bVar26 * 8);
        } while (lVar17 != 0);
        if ((lVar20 != (long)cVar12.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                             ._M_cur + 0x18) && (*(uint *)(lVar20 + 0x20) < 0x1788)) {
          local_208._0_8_ = &local_240;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_208._0_8_,local_2b0,local_208);
          local_208._0_8_ = &local_278;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_208._0_8_,local_2b0,local_208);
        }
      }
      puVar22 = puVar22 + 1;
    } while (puVar22 != puVar2);
    if (local_240._M_element_count == 0) {
LAB_002bd17d:
      sVar24 = SPV_SUCCESS;
    }
    else {
      local_2d8 = _;
      pvVar13 = ValidationState_t::functions(_);
      pFVar18 = (pvVar13->
                super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pFVar3 = (pvVar13->
               super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pFVar18 != pFVar3) {
        do {
          ValidationState_t::EntryPointReferences
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     local_208,local_2d8,pFVar18->id_);
          sVar9 = local_240._M_bucket_count;
          pp_Var8 = local_240._M_buckets;
          for (p_Var14 = local_1f0; p_Var14 != (_Rb_tree_node_base *)(local_208 + 8);
              p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
            uVar21 = (ulong)p_Var14[1]._M_color % sVar9;
            if (pp_Var8[uVar21] != (__node_base_ptr)0x0) {
              p_Var4 = pp_Var8[uVar21]->_M_nxt;
              _Var1 = *(_Rb_tree_color *)&p_Var4[1]._M_nxt;
              do {
                if (p_Var14[1]._M_color == _Var1) {
                  local_2dc = pFVar18->id_;
                  local_2b0._0_8_ = &local_278;
                  std::
                  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  ::
                  _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)local_2b0._0_8_,&local_2dc,local_2b0);
                  goto LAB_002bcedd;
                }
                p_Var4 = p_Var4->_M_nxt;
              } while ((p_Var4 != (_Hash_node_base *)0x0) &&
                      (_Var1 = *(_Rb_tree_color *)&p_Var4[1]._M_nxt, (ulong)_Var1 % sVar9 == uVar21)
                      );
            }
          }
LAB_002bcedd:
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)local_208,local_1f8);
          pFVar18 = pFVar18 + 1;
        } while (pFVar18 != pFVar3);
      }
      this = local_2d8;
      pIVar5 = (local_2d8->ordered_instructions_).
               super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pIVar16 = (local_2d8->ordered_instructions_).
                     super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                     ._M_impl.super__Vector_impl_data._M_start; pIVar16 != pIVar5;
          pIVar16 = pIVar16 + 1) {
        if ((pIVar16->inst_).opcode == 0xfa) {
          uVar10 = Instruction::GetOperandAs<unsigned_int>(pIVar16,1);
          uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar16,2);
          if (uVar10 == uVar11) {
            uVar10 = pIVar16->function_->id_;
            uVar21 = (ulong)uVar10 % local_278._M_bucket_count;
            if (local_278._M_buckets[uVar21] != (__node_base_ptr)0x0) {
              p_Var4 = local_278._M_buckets[uVar21]->_M_nxt;
              uVar11 = *(uint *)&p_Var4[1]._M_nxt;
              do {
                if (uVar10 == uVar11) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,this,SPV_ERROR_INVALID_ID,pIVar16);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,
                             "In entry points using the MaximallyReconvergesKHR execution mode, True Label and False Label must be different labels"
                             ,0x75);
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
                  sVar24 = local_38;
                  goto LAB_002bd20f;
                }
                p_Var4 = p_Var4->_M_nxt;
              } while ((p_Var4 != (_Hash_node_base *)0x0) &&
                      (uVar11 = *(uint *)&p_Var4[1]._M_nxt,
                      (ulong)uVar11 % local_278._M_bucket_count == uVar21));
            }
          }
        }
      }
      pvVar13 = ValidationState_t::functions(this);
      pFVar18 = (pvVar13->
                super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_2c0 = (pvVar13->
                  super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      sVar24 = SPV_SUCCESS;
      if (pFVar18 != local_2c0) {
LAB_002bcfd4:
        uVar21 = (ulong)pFVar18->id_ % local_278._M_bucket_count;
        local_2d0 = pFVar18;
        if (local_278._M_buckets[uVar21] != (__node_base_ptr)0x0) {
          p_Var4 = local_278._M_buckets[uVar21]->_M_nxt;
          uVar10 = *(uint *)&p_Var4[1]._M_nxt;
          while (pFVar18->id_ != uVar10) {
            p_Var4 = p_Var4->_M_nxt;
            if ((p_Var4 == (_Hash_node_base *)0x0) ||
               (uVar10 = *(uint *)&p_Var4[1]._M_nxt,
               (ulong)uVar10 % local_278._M_bucket_count != uVar21)) goto LAB_002bd166;
          }
          pvVar15 = Function::ordered_blocks(pFVar18);
          ppBVar25 = (pvVar15->
                     super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          local_2b8 = (pvVar15->
                      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          if (ppBVar25 != local_2b8) goto LAB_002bd056;
        }
        goto LAB_002bd166;
      }
    }
  }
LAB_002bd20f:
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_240);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_278);
  return sVar24;
LAB_002bd056:
  do {
    local_2c8 = *ppBVar25;
    local_2b0._0_8_ = local_2b0 + 0x30;
    local_2b0._8_8_ = 1;
    local_2b0._16_8_ = (_Hash_node_base *)0x0;
    local_2b0._24_8_ = 0;
    local_2b0._32_4_ = 1.0;
    local_2b0._40_8_ = 0;
    local_2b0._48_8_ = (__node_base_ptr)0x0;
    ppBVar23 = (local_2c8->predecessors_).
               super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppBVar6 = (local_2c8->predecessors_).
              super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppBVar23 != ppBVar6) {
      do {
        local_2dc = (*ppBVar23)->id_;
        local_208._0_8_ =
             (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)local_2b0;
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_2b0,&local_2dc,local_208);
        ppBVar23 = ppBVar23 + 1;
      } while (ppBVar23 != ppBVar6);
      if ((1 < (ulong)local_2b0._24_8_) && (local_2c8->terminator_[-1].inst_.opcode != 0xf6)) {
        pIVar16 = ValidationState_t::FindDef(local_2d8,local_2c8->id_);
        ppVar19 = (pIVar16->uses_).
                  super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar7 = (pIVar16->uses_).
                 super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (ppVar19 != ppVar7) {
          bVar26 = false;
          do {
            while ((uVar10 = (ppVar19->first->inst_).opcode - 0xf6, uVar10 < 6 &&
                   ((0x23U >> (uVar10 & 0x1f) & 1) != 0))) {
              ppVar19 = ppVar19 + 1;
              bVar26 = true;
              if (ppVar19 == ppVar7) goto LAB_002bd149;
            }
            ppVar19 = ppVar19 + 1;
          } while (ppVar19 != ppVar7);
          if (bVar26) goto LAB_002bd149;
        }
        ValidationState_t::diag
                  ((DiagnosticStream *)local_208,local_2d8,SPV_ERROR_INVALID_CFG,pIVar16);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   "In entry points using the MaximallyReconvergesKHR execution mode, this basic block must not have multiple unique predecessors"
                   ,0x7d);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_2b0);
        sVar24 = local_38;
        goto LAB_002bd20f;
      }
    }
LAB_002bd149:
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_2b0);
    ppBVar25 = ppBVar25 + 1;
  } while (ppBVar25 != local_2b8);
LAB_002bd166:
  pFVar18 = local_2d0 + 1;
  if (pFVar18 == local_2c0) goto LAB_002bd17d;
  goto LAB_002bcfd4;
}

Assistant:

spv_result_t StructuredSwitchChecks(ValidationState_t& _, Function* function,
                                    const Instruction* switch_inst,
                                    const BasicBlock* header,
                                    const BasicBlock* merge) {
  std::unordered_set<uint32_t> case_targets;
  for (uint32_t i = 1; i < switch_inst->operands().size(); i += 2) {
    uint32_t target = switch_inst->GetOperandAs<uint32_t>(i);
    if (target != merge->id()) case_targets.insert(target);
  }
  // Tracks how many times each case construct is targeted by another case
  // construct.
  std::map<uint32_t, uint32_t> num_fall_through_targeted;
  uint32_t default_case_fall_through = 0u;
  uint32_t default_target = switch_inst->GetOperandAs<uint32_t>(1u);
  bool default_appears_multiple_times = false;
  for (uint32_t i = 3; i < switch_inst->operands().size(); i += 2) {
    if (default_target == switch_inst->GetOperandAs<uint32_t>(i)) {
      default_appears_multiple_times = true;
      break;
    }
  }
  std::unordered_map<uint32_t, uint32_t> seen_to_fall_through;
  for (uint32_t i = 1; i < switch_inst->operands().size(); i += 2) {
    uint32_t target = switch_inst->GetOperandAs<uint32_t>(i);
    if (target == merge->id()) continue;

    uint32_t case_fall_through = 0u;
    auto seen_iter = seen_to_fall_through.find(target);
    if (seen_iter == seen_to_fall_through.end()) {
      const auto target_block = function->GetBlock(target).first;
      // OpSwitch must dominate all its case constructs.
      if (header->structurally_reachable() &&
          target_block->structurally_reachable() &&
          !header->structurally_dominates(*target_block)) {
        return _.diag(SPV_ERROR_INVALID_CFG, header->label())
               << "Switch header " << _.getIdName(header->id())
               << " does not structurally dominate its case construct "
               << _.getIdName(target);
      }

      if (auto error = FindCaseFallThrough(_, target_block, &case_fall_through,
                                           merge, case_targets, function)) {
        return error;
      }

      // Track how many time the fall through case has been targeted.
      if (case_fall_through != 0u) {
        auto where = num_fall_through_targeted.lower_bound(case_fall_through);
        if (where == num_fall_through_targeted.end() ||
            where->first != case_fall_through) {
          num_fall_through_targeted.insert(
              where, std::make_pair(case_fall_through, 1));
        } else {
          where->second++;
        }
      }
      seen_to_fall_through.insert(std::make_pair(target, case_fall_through));
    } else {
      case_fall_through = seen_iter->second;
    }

    if (case_fall_through == default_target &&
        !default_appears_multiple_times) {
      case_fall_through = default_case_fall_through;
    }
    if (case_fall_through != 0u) {
      bool is_default = i == 1;
      if (is_default) {
        default_case_fall_through = case_fall_through;
      } else {
        // Allow code like:
        // case x:
        // case y:
        //   ...
        // case z:
        //
        // Where x and y target the same block and fall through to z.
        uint32_t j = i;
        while ((j + 2 < switch_inst->operands().size()) &&
               target == switch_inst->GetOperandAs<uint32_t>(j + 2)) {
          j += 2;
        }
        // If Target T1 branches to Target T2, or if Target T1 branches to the
        // Default target and the Default target branches to Target T2, then T1
        // must immediately precede T2 in the list of OpSwitch Target operands.
        if ((switch_inst->operands().size() < j + 2) ||
            (case_fall_through != switch_inst->GetOperandAs<uint32_t>(j + 2))) {
          return _.diag(SPV_ERROR_INVALID_CFG, switch_inst)
                 << "Case construct that targets " << _.getIdName(target)
                 << " has branches to the case construct that targets "
                 << _.getIdName(case_fall_through)
                 << ", but does not immediately precede it in the "
                    "OpSwitch's target list";
        }
      }
    }
  }

  // Each case construct must be branched to by at most one other case
  // construct.
  for (const auto& pair : num_fall_through_targeted) {
    if (pair.second > 1) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(pair.first))
             << "Multiple case constructs have branches to the case construct "
                "that targets "
             << _.getIdName(pair.first);
    }
  }

  return SPV_SUCCESS;
}